

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

bool __thiscall cmCTestLaunch::CheckResults(cmCTestLaunch *this)

{
  bool bVar1;
  cmCTestLaunch *this_local;
  
  if (((this->Reporter).Passthru & 1U) == 0) {
    bVar1 = cmCTestLaunchReporter::IsError(&this->Reporter);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else if ((((this->HaveErr & 1U) != 0) &&
             (bVar1 = ScrapeLog(this,&(this->Reporter).LogErr), bVar1)) ||
            (((this->HaveOut & 1U) != 0 && (bVar1 = ScrapeLog(this,&(this->Reporter).LogOut), bVar1)
             ))) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestLaunch::CheckResults()
{
  // Skip XML in passthru mode.
  if (this->Reporter.Passthru) {
    return true;
  }

  // We always report failure for error conditions.
  if (this->Reporter.IsError()) {
    return false;
  }

  // Scrape the output logs to look for warnings.
  if ((this->HaveErr && this->ScrapeLog(this->Reporter.LogErr)) ||
      (this->HaveOut && this->ScrapeLog(this->Reporter.LogOut))) {
    return false;
  }
  return true;
}